

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamWriterPrivate::CreatePackedCigar
          (BamWriterPrivate *this,
          vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarOperations,
          string *packedCigar)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pCVar3;
  BamException *this_00;
  uint *puVar4;
  uint uVar5;
  pointer pCVar6;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::resize
            ((ulong)packedCigar,
             (char)((long)(cigarOperations->
                          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(cigarOperations->
                          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 1));
  pCVar6 = (cigarOperations->
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (cigarOperations->
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar3) {
    puVar4 = (uint *)(packedCigar->_M_dataplus)._M_p;
    do {
      cVar2 = pCVar6->Type;
      switch(cVar2) {
      case 'H':
        uVar5 = 5;
        break;
      case 'I':
        uVar5 = 1;
        break;
      case 'J':
      case 'K':
      case 'L':
      case 'O':
      case 'Q':
      case 'R':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
switchD_0014f559_caseD_4a:
        paVar1 = &local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"invalid CIGAR operation type","");
        std::operator+(&local_48,&local_68,pCVar6->Type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        this_00 = (BamException *)__cxa_allocate_exception(0x28);
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"BamWriter::CreatePackedCigar","");
        BamException::BamException(this_00,&local_68,&local_48);
        __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
      case 'M':
        uVar5 = 0;
        break;
      case 'N':
        uVar5 = 3;
        break;
      case 'P':
        uVar5 = 6;
        break;
      case 'S':
        uVar5 = 4;
        break;
      case 'X':
        uVar5 = 8;
        break;
      default:
        if (cVar2 == '=') {
          uVar5 = 7;
        }
        else {
          if (cVar2 != 'D') goto switchD_0014f559_caseD_4a;
          uVar5 = 2;
        }
      }
      *puVar4 = pCVar6->Length << 4 | uVar5;
      puVar4 = puVar4 + 1;
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar3);
  }
  return;
}

Assistant:

void BamWriterPrivate::CreatePackedCigar(const std::vector<CigarOp>& cigarOperations,
                                         std::string& packedCigar)
{

    // initialize
    const std::size_t numCigarOperations = cigarOperations.size();
    packedCigar.resize(numCigarOperations * Constants::BAM_SIZEOF_INT);

    // pack the cigar data into the string
    unsigned int* pPackedCigar = (unsigned int*)packedCigar.data();

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator coIter = cigarOperations.begin();
    std::vector<CigarOp>::const_iterator coEnd = cigarOperations.end();
    for (; coIter != coEnd; ++coIter) {

        // store op in packedCigar
        uint8_t cigarOp;
        switch (coIter->Type) {
            case (Constants::BAM_CIGAR_MATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MATCH;
                break;
            case (Constants::BAM_CIGAR_INS_CHAR):
                cigarOp = Constants::BAM_CIGAR_INS;
                break;
            case (Constants::BAM_CIGAR_DEL_CHAR):
                cigarOp = Constants::BAM_CIGAR_DEL;
                break;
            case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_REFSKIP;
                break;
            case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_SOFTCLIP;
                break;
            case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_HARDCLIP;
                break;
            case (Constants::BAM_CIGAR_PAD_CHAR):
                cigarOp = Constants::BAM_CIGAR_PAD;
                break;
            case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_SEQMATCH;
                break;
            case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MISMATCH;
                break;
            default:
                const std::string message =
                    std::string("invalid CIGAR operation type") + coIter->Type;
                throw BamException("BamWriter::CreatePackedCigar", message);
        }

        *pPackedCigar = coIter->Length << Constants::BAM_CIGAR_SHIFT | cigarOp;
        pPackedCigar++;
    }
}